

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-mock-test.cc
# Opt level: O0

void __thiscall
BufferedFileTest_CloseNoRetryInDtor_Test::TestBody(BufferedFileTest_CloseNoRetryInDtor_Test *this)

{
  bool bVar1;
  buffered_file *p;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  string gtest_output;
  OutputRedirect gtest_redir;
  int in_stack_000000fc;
  undefined1 in_stack_00000100 [16];
  string gtest_expected_output;
  AssertionResult gtest_ar;
  int saved_fclose_count;
  scoped_ptr<fmt::v5::buffered_file> f;
  file write_end;
  file read_end;
  OutputRedirect *in_stack_00000ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  OutputRedirect *in_stack_fffffffffffffeb0;
  AssertionResult *in_stack_fffffffffffffeb8;
  int line;
  AssertionResult *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  Type type;
  OutputRedirect *in_stack_fffffffffffffed0;
  Message *in_stack_ffffffffffffff18;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff20;
  string local_c0 [64];
  string local_80 [32];
  string local_60 [32];
  AssertionResult local_40;
  undefined4 local_2c;
  scoped_ptr<fmt::v5::buffered_file> local_28 [3];
  file local_10;
  file local_c [3];
  
  fmt::v5::file::file(local_c);
  fmt::v5::file::file(&local_10);
  fmt::v5::file::pipe(local_c,&local_10.fd_);
  p = (buffered_file *)operator_new(8);
  fmt::v5::file::fdopen((file *)p,(int)local_c,"r");
  testing::internal::scoped_ptr<fmt::v5::buffered_file>::scoped_ptr(local_28,p);
  local_2c = 0;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (bVar1) {
    fmt::v5::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_fffffffffffffea0,
               (char *)in_stack_fffffffffffffe98);
    format_system_error_abi_cxx11_(in_stack_000000fc,(string_view)in_stack_00000100);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                   (char *)in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_80);
    OutputRedirect::OutputRedirect(in_stack_fffffffffffffed0,(FILE *)in_stack_fffffffffffffec8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (anonymous_namespace)::fclose_count = 1;
      testing::internal::scoped_ptr<fmt::v5::buffered_file>::reset
                ((scoped_ptr<fmt::v5::buffered_file> *)in_stack_fffffffffffffeb0,
                 (buffered_file *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      local_2c = (anonymous_namespace)::fclose_count;
      (anonymous_namespace)::fclose_count = 0;
    }
    OutputRedirect::restore_and_read_abi_cxx11_(in_stack_00000ed8);
    bVar1 = std::operator!=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (bVar1) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffed0,
                 (char (*) [121])in_stack_fffffffffffffec8);
      in_stack_fffffffffffffed0 =
           (OutputRedirect *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffed0,
                      (char (*) [11])in_stack_fffffffffffffec8);
      in_stack_fffffffffffffec8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      in_stack_fffffffffffffec0 =
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffed0,
                      (char (*) [2])in_stack_fffffffffffffec8);
      in_stack_fffffffffffffeb8 =
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffffed0,
                      (char (*) [11])in_stack_fffffffffffffec8);
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    std::__cxx11::string::~string(local_c0);
    OutputRedirect::~OutputRedirect(in_stack_fffffffffffffeb0);
    std::__cxx11::string::~string(local_60);
    type = (Type)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    if (!bVar1) goto LAB_00115a70;
  }
  type = (Type)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffed0);
  in_stack_fffffffffffffeb0 =
       (OutputRedirect *)testing::AssertionResult::failure_message((AssertionResult *)0x1159cb);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffed0,type,&in_stack_fffffffffffffec0->success_,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(char *)in_stack_fffffffffffffeb0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_ffffffffffffff20.ptr_,in_stack_ffffffffffffff18);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
  testing::Message::~Message((Message *)0x115a28);
LAB_00115a70:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115a7d);
  testing::internal::EqHelper<false>::Compare<int,int>
            (&in_stack_fffffffffffffeb8->success_,(char *)in_stack_fffffffffffffeb0,
             (int *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             (int *)in_stack_fffffffffffffea0);
  line = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x115b15)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffed0,type,&in_stack_fffffffffffffec0->success_,
               line,(char *)in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff20.ptr_,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x115b63);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115bb2);
  testing::internal::scoped_ptr<fmt::v5::buffered_file>::~scoped_ptr
            ((scoped_ptr<fmt::v5::buffered_file> *)0x115bbf);
  fmt::v5::file::~file((file *)in_stack_fffffffffffffeb0);
  fmt::v5::file::~file((file *)in_stack_fffffffffffffeb0);
  return;
}

Assistant:

TEST(BufferedFileTest, CloseNoRetryInDtor) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  scoped_ptr<buffered_file> f(new buffered_file(read_end.fdopen("r")));
  int saved_fclose_count = 0;
  EXPECT_WRITE(stderr, {
    fclose_count = 1;
    f.reset(FMT_NULL);
    saved_fclose_count = fclose_count;
    fclose_count = 0;
  }, format_system_error(EINTR, "cannot close file") + "\n");
  EXPECT_EQ(2, saved_fclose_count);
}